

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

StatusOr<bool> * __thiscall
draco::PlyReader::ParseProperty
          (StatusOr<bool> *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  DataType data_type;
  DataType list_type;
  PlyReader *this_00;
  pointer pPVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string property_name;
  string data_type_str;
  string list_type_str;
  string line;
  DecoderBuffer line_buffer;
  allocator<char> local_181;
  undefined1 local_180 [56];
  undefined1 local_148 [32];
  string local_128;
  string local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  DecoderBuffer local_c8;
  undefined1 local_88 [96];
  
  if ((this->elements_).super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->elements_).super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->status_).code_ = OK;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
    (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->value_ = false;
    return __return_storage_ptr__;
  }
  local_c8.bit_mode_ = buffer->bit_mode_;
  local_c8._49_1_ = buffer->field_0x31;
  local_c8.bitstream_version_ = buffer->bitstream_version_;
  local_c8._52_4_ = *(undefined4 *)&buffer->field_0x34;
  local_c8.data_ = buffer->data_;
  local_c8.data_size_ = buffer->data_size_;
  local_c8.pos_ = buffer->pos_;
  local_c8.bit_decoder_.bit_buffer_ = (buffer->bit_decoder_).bit_buffer_;
  local_c8.bit_decoder_.bit_buffer_end_ = (buffer->bit_decoder_).bit_buffer_end_;
  local_c8.bit_decoder_.bit_offset_ = (buffer->bit_decoder_).bit_offset_;
  local_e8._0_8_ = local_d8;
  local_e8._8_8_ = (pointer)0x0;
  local_d8[0] = '\0';
  this_00 = (PlyReader *)local_e8;
  parser::ParseLine(&local_c8,(string *)this_00);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_108.field_2._M_local_buf[0] = '\0';
  local_148._0_8_ = local_148 + 0x10;
  local_148._8_8_ = 0;
  local_148[0x10] = kLittleEndian;
  pPVar4 = (pointer)local_180;
  SplitWords((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pPVar4,this_00,(string *)local_e8);
  if (((ulong)(local_180._8_8_ - local_180._0_8_) < 0x41) ||
     (pPVar4 = (pointer)local_180._0_8_,
     bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_180._0_8_,"property"), !bVar2)) {
LAB_0011c060:
    bVar2 = false;
  }
  else {
    pPVar4 = (pointer)(local_180._0_8_ + 0x20);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pPVar4,"list");
    if (!bVar2) goto LAB_0011c060;
    std::__cxx11::string::_M_assign((string *)(local_148 + 0x20));
    pPVar4 = (pointer)local_148;
    std::__cxx11::string::_M_assign((string *)pPVar4);
    bVar2 = true;
  }
  if (((ulong)(local_180._8_8_ - local_180._0_8_) < 0x81) ||
     (pPVar4 = (pointer)local_180._0_8_,
     bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_180._0_8_,"property"), !bVar3)) {
LAB_0011c0df:
    if (!bVar2) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = false;
      goto LAB_0011c278;
    }
    bVar2 = false;
  }
  else {
    pPVar4 = (pointer)(local_180._0_8_ + 0x20);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pPVar4,"list");
    if (!bVar3) goto LAB_0011c0df;
    std::__cxx11::string::_M_assign((string *)&local_108);
    std::__cxx11::string::_M_assign((string *)(local_148 + 0x20));
    bVar2 = true;
    pPVar4 = (pointer)local_148;
    std::__cxx11::string::_M_assign((string *)pPVar4);
  }
  data_type = GetDataTypeFromString((PlyReader *)pPVar4,(string *)(local_148 + 0x20));
  if (data_type == DT_INVALID) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_180 + 0x18),"Wrong property data type",&local_181);
    local_88._0_4_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)(local_88 + 8),(string *)(local_180 + 0x18));
    Status::Status(&__return_storage_ptr__->status_,(Status *)local_88);
  }
  else {
    list_type = DT_INVALID;
    if ((!bVar2) ||
       (list_type = GetDataTypeFromString((PlyReader *)pPVar4,&local_108), list_type != DT_INVALID))
    {
      pPVar4 = (this->elements_).
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_finish;
      PlyProperty::PlyProperty((PlyProperty *)local_88,(string *)local_148,data_type,list_type);
      PlyElement::AddProperty(pPVar4 + -1,(PlyProperty *)local_88);
      PlyProperty::~PlyProperty((PlyProperty *)local_88);
      uVar1 = local_c8._48_8_;
      buffer->bit_mode_ = local_c8.bit_mode_;
      buffer->field_0x31 = local_c8._49_1_;
      buffer->bitstream_version_ = local_c8.bitstream_version_;
      (buffer->bit_decoder_).bit_buffer_end_ = local_c8.bit_decoder_.bit_buffer_end_;
      (buffer->bit_decoder_).bit_offset_ = local_c8.bit_decoder_.bit_offset_;
      buffer->pos_ = local_c8.pos_;
      (buffer->bit_decoder_).bit_buffer_ = local_c8.bit_decoder_.bit_buffer_;
      buffer->data_ = local_c8.data_;
      buffer->data_size_ = local_c8.data_size_;
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = true;
      local_c8._48_8_ = uVar1;
      goto LAB_0011c278;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_180 + 0x18),"Wrong property list type",&local_181);
    local_88._0_4_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)(local_88 + 8),(string *)(local_180 + 0x18));
    Status::Status(&__return_storage_ptr__->status_,(Status *)local_88);
  }
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_180 + 0x18));
LAB_0011c278:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_180);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)(local_148 + 0x20));
  std::__cxx11::string::~string((string *)local_e8);
  DecoderBuffer::BitDecoder::~BitDecoder(&local_c8.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<bool> PlyReader::ParseProperty(DecoderBuffer *buffer) {
  if (elements_.empty()) {
    return false;  // Ignore properties if there is no active element.
  }
  DecoderBuffer line_buffer(*buffer);
  std::string line;
  parser::ParseLine(&line_buffer, &line);

  std::string data_type_str, list_type_str, property_name;
  bool property_search = false;
  const std::vector<std::string> words = SplitWords(line);
  if (words.size() >= 3 && words[0] == "property" && words[1] != "list") {
    property_search = true;
    data_type_str = words[1];
    property_name = words[2];
  }

  bool property_list_search = false;
  if (words.size() >= 5 && words[0] == "property" && words[1] == "list") {
    property_list_search = true;
    list_type_str = words[2];
    data_type_str = words[3];
    property_name = words[4];
  }
  if (!property_search && !property_list_search) {
    return false;
  }
  const DataType data_type = GetDataTypeFromString(data_type_str);
  if (data_type == DT_INVALID) {
    return Status(Status::INVALID_PARAMETER, "Wrong property data type");
  }
  DataType list_type = DT_INVALID;
  if (property_list_search) {
    list_type = GetDataTypeFromString(list_type_str);
    if (list_type == DT_INVALID) {
      return Status(Status::INVALID_PARAMETER, "Wrong property list type");
    }
  }
  elements_.back().AddProperty(
      PlyProperty(property_name, data_type, list_type));
  *buffer = line_buffer;
  return true;
}